

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

uint32_t __thiscall GGWave::encodeSize_samples(GGWave *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if ((this->m_tx).hasData != false) {
    iVar2 = this->m_samplesPerFrame;
    if (this->m_needResampling == true) {
      iVar2 = Resampler::resample(&this->m_resampler,this->m_sampleRate / this->m_sampleRateOut,
                                  iVar2,(this->m_tx).output.m_data,(float *)0x0);
      iVar2 = iVar2 + 1;
    }
    uVar1 = (this->m_tx).dataLength;
    uVar3 = 2;
    if ((3 < (int)uVar1) && (uVar3 = 4, 0xe < uVar1)) {
      uVar3 = (uint)((ulong)uVar1 * 0xcccccccd >> 0x21) & 0xfffffffe;
    }
    iVar4 = (int)(this->m_tx).protocol.bytesPerTx;
    return ((int)(this->m_tx).protocol.framesPerTx * (int)(this->m_tx).protocol.extra *
            ((int)(uVar1 + uVar3 + this->m_encodedDataOffset + iVar4 + -1) / iVar4) +
           this->m_nMarkerFrames * 2) * iVar2;
  }
  return 0;
}

Assistant:

uint32_t GGWave::encodeSize_samples() const {
    if (m_tx.hasData == false) {
        return 0;
    }

    float factor = 1.0f;
    int samplesPerFrameOut = m_samplesPerFrame;
    if (m_needResampling) {
        factor = m_sampleRate/m_sampleRateOut;
        // note : +1 extra sample in order to overestimate the buffer size
        samplesPerFrameOut = m_resampler.resample(factor, m_samplesPerFrame, m_tx.output.data(), nullptr) + 1;
    }
    const int nECCBytesPerTx = getECCBytesForLength(m_tx.dataLength);
    const int sendDataLength = m_tx.dataLength + m_encodedDataOffset;
    const int totalBytes = sendDataLength + nECCBytesPerTx;
    const int totalDataFrames = m_tx.protocol.extra*((totalBytes + m_tx.protocol.bytesPerTx - 1)/m_tx.protocol.bytesPerTx)*m_tx.protocol.framesPerTx;

    return (
            m_nMarkerFrames + totalDataFrames + m_nMarkerFrames
           )*samplesPerFrameOut;
}